

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_SortTest(void)

{
  int iVar1;
  void *__base;
  abctime aVar2;
  abctime aVar3;
  int fUseCost;
  abctime clk;
  int *pPerm;
  int *pArray;
  int local_10;
  int nSize;
  int i;
  int fUseNew;
  
  __base = malloc(200000000);
  srand(1000);
  for (local_10 = 0; local_10 < 50000000; local_10 = local_10 + 1) {
    iVar1 = rand();
    *(int *)((long)__base + (long)local_10 * 4) = iVar1;
  }
  aVar2 = Abc_Clock();
  qsort(__base,50000000,4,Abc_SortNumCompare);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Old sort",aVar3 - aVar2);
  local_10 = 1;
  while( true ) {
    if (49999999 < local_10) {
      free(__base);
      return;
    }
    if (*(int *)((long)__base + (long)local_10 * 4) <
        *(int *)((long)__base + (long)(local_10 + -1) * 4)) break;
    local_10 = local_10 + 1;
  }
  __assert_fail("pArray[i-1] <= pArray[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                ,0x1b9,"void Abc_SortTest()");
}

Assistant:

void Abc_SortTest()
{
    int fUseNew = 0;
    int i, nSize = 50000000;
    int * pArray = (int *)malloc( sizeof(int) * nSize );
    int * pPerm;
    abctime clk;
    // generate numbers
    srand( 1000 );
    for ( i = 0; i < nSize; i++ )
        pArray[i] = rand();

    // try sorting
    if ( fUseNew )
    {
        int fUseCost = 1;
        if ( fUseCost )
        {
            clk = Abc_Clock();
            pPerm = Abc_MergeSortCost( pArray, nSize );
            Abc_PrintTime( 1, "New sort", Abc_Clock() - clk );
            // check
            for ( i = 1; i < nSize; i++ )
                assert( pArray[pPerm[i-1]] <= pArray[pPerm[i]] );
            free( pPerm );
        }
        else
        {
            clk = Abc_Clock();
            Abc_MergeSort( pArray, nSize );
            Abc_PrintTime( 1, "New sort", Abc_Clock() - clk );
            // check
            for ( i = 1; i < nSize; i++ )
                assert( pArray[i-1] <= pArray[i] );
        }
    }
    else
    {
        clk = Abc_Clock();
        qsort( (void *)pArray, nSize, sizeof(int), (int (*)(const void *, const void *)) Abc_SortNumCompare );
        Abc_PrintTime( 1, "Old sort", Abc_Clock() - clk );
        // check
        for ( i = 1; i < nSize; i++ )
            assert( pArray[i-1] <= pArray[i] );
    }

    free( pArray );
}